

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedBarr_fast(word *a,word *mod,size_t n,word *barr_param,void *stack)

{
  int iVar1;
  word *a_00;
  word wVar2;
  word *in_RCX;
  void *in_RDX;
  word *in_RSI;
  word *in_RDI;
  long in_R8;
  word *qm;
  word *q;
  word *m;
  
  a_00 = (word *)(in_R8 + (long)in_RDX * 0x10 + 0x18);
  m = a_00 + (long)in_RDX * 2 + 2;
  zzMul((word *)stack,q,(size_t)qm,in_RDI,(size_t)in_RSI,in_RDX);
  zzMul((word *)stack,q,(size_t)qm,in_RDI,(size_t)in_RSI,in_RDX);
  zzSub2(in_RDI,a_00,(long)in_RDX + 1);
  while( true ) {
    iVar1 = wwCmp2(in_RSI,(size_t)in_RDX,in_RCX,(size_t)m);
    if (iVar1 < 0) break;
    wVar2 = zzSub2(in_RDI,in_RSI,(size_t)in_RDX);
    in_RDI[(long)in_RDX] = in_RDI[(long)in_RDX] - wVar2;
  }
  return;
}

Assistant:

void FAST(zzRedBarr)(word a[], const word mod[], size_t n, 
	const word barr_param[], void* stack)
{
	// переменные в stack
	word* q = (word*)stack;
	word* qm = q + (n + 1) + (n + 2);
	stack = qm + (n + 2) + n;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(wwIsDisjoint2(a, 2 * n, barr_param, n + 2));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// q <- (a \div B^{n - 1}) * barr_param
	zzMul(q, a + n - 1, n + 1, barr_param, n + 2, stack);
	// qm <- (q \div B^{n + 1}) * mod
	zzMul(qm, q + n + 1, n + 2, mod, n, stack);
	// a <- [n + 1]a - [n + 1]qm
	zzSub2(a, qm, n + 1);
	// пока a >= mod: a <- a - mod
	while (wwCmp2(a, n + 1, mod, n) >= 0)
		a[n] -= zzSub2(a, mod, n);
}